

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O2

void __thiscall
duckdb::ReservoirSamplePercentage::AddToReservoir(ReservoirSamplePercentage *this,DataChunk *input)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  idx_t iVar1;
  ulong uVar2;
  Allocator *args;
  _Head_base<0UL,_duckdb::ReservoirSample_*,_false> _Var3;
  pointer pBVar4;
  pointer pRVar5;
  SelectionVector *sel;
  pointer pVVar6;
  idx_t i;
  idx_t iVar7;
  idx_t count_p;
  DataChunk new_chunk;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  DataChunk local_70;
  
  iVar1 = input->count;
  this_00 = &(this->super_BlockingSample).base_reservoir_sample;
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  pBVar4->num_entries_seen_total = pBVar4->num_entries_seen_total + iVar1;
  iVar1 = this->current_count;
  uVar2 = input->count;
  if (100000 < iVar1 + uVar2) {
    count_p = -(iVar1 - 100000);
    if (iVar1 - 100000 != 0) {
      if (uVar2 == count_p) {
        DataChunk::Flatten(input);
        input->count = uVar2;
        pRVar5 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                 ::operator->(&this->current_sample);
        (*(pRVar5->super_BlockingSample)._vptr_BlockingSample[2])(pRVar5,input);
      }
      else {
        DataChunk::DataChunk(&local_70);
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_88,input);
        DataChunk::InitializeEmpty(&local_70,(vector<duckdb::LogicalType,_true> *)&local_88);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88)
        ;
        sel = FlatVector::IncrementalSelectionVector();
        DataChunk::Slice(&local_70,input,sel,count_p,0);
        DataChunk::Flatten(&local_70);
        pRVar5 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
                 ::operator->(&this->current_sample);
        (*(pRVar5->super_BlockingSample)._vptr_BlockingSample[2])(pRVar5,&local_70);
        DataChunk::~DataChunk(&local_70);
      }
    }
    iVar1 = (iVar1 - 100000) + uVar2;
    if (uVar2 != count_p) {
      SelectionVector::SelectionVector((SelectionVector *)&local_70,iVar1);
      pVVar6 = local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (iVar7 = count_p; iVar7 < uVar2; iVar7 = iVar7 + 1) {
        *(int *)&((BlockingSample *)&pVVar6->vector_type)->_vptr_BlockingSample = (int)iVar7;
        pVVar6 = (pointer)&pVVar6->field_0x4;
      }
      DataChunk::Slice(input,(SelectionVector *)&local_70,iVar1);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>,std::allocator<duckdb::unique_ptr<duckdb::ReservoirSample,std::default_delete<duckdb::ReservoirSample>,true>>>
                *)&this->finished_samples,&this->current_sample);
    args = this->allocator;
    pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    local_88.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = RandomEngine::NextRandomInteger((RandomEngine *)pBVar4)
    ;
    make_uniq<duckdb::ReservoirSample,duckdb::Allocator&,unsigned_long&,unsigned_int>
              ((duckdb *)&local_70,args,&this->reservoir_sample_size,(uint *)&local_88);
    pVVar6 = local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    _Var3._M_head_impl =
         (this->current_sample).
         super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
         .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl;
    (this->current_sample).
    super_unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>._M_t.
    super___uniq_ptr_impl<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ReservoirSample_*,_std::default_delete<duckdb::ReservoirSample>_>
    .super__Head_base<0UL,_duckdb::ReservoirSample_*,_false>._M_head_impl =
         (ReservoirSample *)pVVar6;
    if (_Var3._M_head_impl != (ReservoirSample *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BlockingSample + 8))();
      if (local_70.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_70.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (uVar2 != count_p) {
      pRVar5 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>
               ::operator->(&this->current_sample);
      (*(pRVar5->super_BlockingSample)._vptr_BlockingSample[2])(pRVar5,input);
    }
    this->current_count = iVar1;
    return;
  }
  this->current_count = iVar1 + uVar2;
  pRVar5 = unique_ptr<duckdb::ReservoirSample,_std::default_delete<duckdb::ReservoirSample>,_true>::
           operator->(&this->current_sample);
  (*(pRVar5->super_BlockingSample)._vptr_BlockingSample[2])(pRVar5,input);
  return;
}

Assistant:

void ReservoirSamplePercentage::AddToReservoir(DataChunk &input) {
	base_reservoir_sample->num_entries_seen_total += input.size();
	if (current_count + input.size() > RESERVOIR_THRESHOLD) {
		// we don't have enough space in our current reservoir
		// first check what we still need to append to the current sample
		idx_t append_to_current_sample_count = RESERVOIR_THRESHOLD - current_count;
		idx_t append_to_next_sample = input.size() - append_to_current_sample_count;
		if (append_to_current_sample_count > 0) {
			// we have elements remaining, first add them to the current sample
			if (append_to_next_sample > 0) {
				// we need to also add to the next sample
				DataChunk new_chunk;
				new_chunk.InitializeEmpty(input.GetTypes());
				new_chunk.Slice(input, *FlatVector::IncrementalSelectionVector(), append_to_current_sample_count);
				new_chunk.Flatten();
				current_sample->AddToReservoir(new_chunk);
			} else {
				input.Flatten();
				input.SetCardinality(append_to_current_sample_count);
				current_sample->AddToReservoir(input);
			}
		}
		if (append_to_next_sample > 0) {
			// slice the input for the remainder
			SelectionVector sel(append_to_next_sample);
			for (idx_t i = append_to_current_sample_count; i < append_to_next_sample + append_to_current_sample_count;
			     i++) {
				sel.set_index(i - append_to_current_sample_count, i);
			}
			input.Slice(sel, append_to_next_sample);
		}
		// now our first sample is filled: append it to the set of finished samples
		finished_samples.push_back(std::move(current_sample));

		// allocate a new sample, and potentially add the remainder of the current input to that sample
		current_sample = make_uniq<ReservoirSample>(allocator, reservoir_sample_size, base_reservoir_sample->random());
		if (append_to_next_sample > 0) {
			current_sample->AddToReservoir(input);
		}
		current_count = append_to_next_sample;
	} else {
		// we can just append to the current sample
		current_count += input.size();
		current_sample->AddToReservoir(input);
	}
}